

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::isOutputBuiltIn(HlslParseContext *this,TQualifier *qualifier)

{
  bool local_32;
  bool local_31;
  TQualifier *qualifier_local;
  HlslParseContext *this_local;
  
  switch(*(uint *)&qualifier->field_0x8 >> 7 & 0x1ff) {
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    local_31 = false;
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment) {
      local_31 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangCompute;
    }
    this_local._7_1_ = local_31;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case 0x34:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry;
    break;
  case 0x35:
  case 0x36:
    local_32 = true;
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry) {
      local_32 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex;
    }
    this_local._7_1_ = local_32;
    break;
  case 0x38:
  case 0x39:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl;
    break;
  case 0x43:
  case 0x47:
  case 0x91:
  case 0x92:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::isOutputBuiltIn(const TQualifier& qualifier) const
{
    switch (qualifier.builtIn) {
    case EbvPosition:
    case EbvPointSize:
    case EbvClipVertex:
    case EbvClipDistance:
    case EbvCullDistance:
        return language != EShLangFragment && language != EShLangCompute;
    case EbvFragDepth:
    case EbvFragDepthGreater:
    case EbvFragDepthLesser:
    case EbvSampleMask:
        return language == EShLangFragment;
    case EbvLayer:
    case EbvViewportIndex:
        return language == EShLangGeometry || language == EShLangVertex;
    case EbvPrimitiveId:
        return language == EShLangGeometry;
    case EbvTessLevelInner:
    case EbvTessLevelOuter:
        return language == EShLangTessControl;
    default:
        return false;
    }
}